

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O2

bool __thiscall Opcode::AABBQuantizedTree::Build(AABBQuantizedTree *this,AABBTree *tree)

{
  AABBCollisionNode *linear;
  AABBCollisionNode *pAVar1;
  sword *psVar2;
  ulong *puVar3;
  float fVar4;
  float fVar5;
  AABBQuantizedNode *pAVar6;
  AABBQuantizedNode *pAVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  udword i;
  ulong *puVar10;
  ulong *puVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  AABBQuantizedNode *pAVar15;
  udword j;
  uword *puVar16;
  uword uVar17;
  ulong uVar18;
  int iVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar34;
  ulong uVar32;
  undefined1 auVar33 [16];
  float fVar35;
  float local_50 [4];
  undefined8 local_40;
  float local_38;
  udword CurID;
  
  if (tree == (AABBTree *)0x0) {
    return false;
  }
  uVar14 = tree->mTotalNbNodes;
  if (uVar14 == (tree->super_AABBTreeNode).mNbPrimitives * 2 - 1) {
    (this->super_AABBOptimizedTree).mNbNodes = uVar14;
    pAVar6 = this->mNodes;
    if (pAVar6 != (AABBQuantizedNode *)0x0) {
      operator_delete__(&pAVar6[-1].mData,pAVar6[-1].mData * 0x18 + 8);
      this->mNodes = (AABBQuantizedNode *)0x0;
      uVar14 = (this->super_AABBOptimizedTree).mNbNodes;
    }
    uVar18 = (ulong)uVar14;
    puVar10 = (ulong *)operator_new__(uVar18 << 5 | 8);
    *puVar10 = uVar18;
    auVar25 = _DAT_001c92b0;
    auVar30 = _DAT_001c8360;
    linear = (AABBCollisionNode *)(puVar10 + 1);
    if (uVar14 != 0) {
      uVar12 = uVar18 + 0x7ffffffffffffff & 0x7ffffffffffffff;
      auVar19._8_4_ = (int)uVar12;
      auVar19._0_8_ = uVar12;
      auVar19._12_4_ = (int)(uVar12 >> 0x20);
      lVar13 = 0;
      auVar19 = auVar19 ^ _DAT_001c8360;
      puVar11 = puVar10;
      do {
        auVar27._8_4_ = (int)lVar13;
        auVar27._0_8_ = lVar13;
        auVar27._12_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar27 = (auVar27 | auVar25) ^ auVar30;
        bVar9 = auVar19._0_4_ < auVar27._0_4_;
        iVar21 = auVar19._4_4_;
        iVar34 = auVar27._4_4_;
        if ((bool)(~(iVar21 < iVar34 || iVar34 == iVar21 && bVar9) & 1)) {
          puVar11[4] = 0;
        }
        if (iVar21 >= iVar34 && (iVar34 != iVar21 || !bVar9)) {
          puVar11[8] = 0;
        }
        lVar13 = lVar13 + 2;
        puVar11 = puVar11 + 8;
      } while ((uVar12 - ((uint)(uVar18 + 0x7ffffffffffffff) & 1)) + 2 != lVar13);
    }
    CurID = 1;
    _BuildCollisionTree(linear,0,&CurID,&tree->super_AABBTreeNode);
    uVar18 = (ulong)(this->super_AABBOptimizedTree).mNbNodes;
    puVar11 = (ulong *)operator_new__(uVar18 * 0x18 + 8);
    pAVar6 = (AABBQuantizedNode *)(puVar11 + 1);
    *puVar11 = uVar18;
    auVar25 = _DAT_001c92b0;
    auVar30 = _DAT_001c8360;
    if (uVar18 != 0) {
      uVar12 = 0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar18 * 0x18 - 0x18;
      auVar8 = auVar8 / ZEXT816(0x18);
      auVar20._8_4_ = auVar8._0_4_;
      auVar20._0_8_ = auVar8._0_8_;
      auVar20._12_4_ = auVar8._4_4_;
      auVar20 = auVar20 ^ _DAT_001c8360;
      puVar3 = puVar11;
      do {
        auVar28._8_4_ = (int)uVar12;
        auVar28._0_8_ = uVar12;
        auVar28._12_4_ = (int)(uVar12 >> 0x20);
        auVar19 = (auVar28 | auVar25) ^ auVar30;
        if ((bool)(~(auVar19._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar19._0_4_ ||
                    auVar20._4_4_ < auVar19._4_4_) & 1)) {
          puVar3[3] = 0;
        }
        if ((auVar19._12_4_ != auVar20._12_4_ || auVar19._8_4_ <= auVar20._8_4_) &&
            auVar19._12_4_ <= auVar20._12_4_) {
          puVar3[6] = 0;
        }
        uVar12 = uVar12 + 2;
        puVar3 = puVar3 + 6;
      } while ((auVar8._0_8_ + 2U & 0x1ffffffffffffffe) != uVar12);
    }
    this->mNodes = pAVar6;
    auVar30 = _DAT_001c72f0;
    auVar25 = _DAT_001d5ee0;
    for (lVar13 = 0; uVar18 << 5 != lVar13; lVar13 = lVar13 + 0x20) {
      puVar3 = (ulong *)((long)puVar10 + lVar13 + 8);
      auVar24._0_8_ = *puVar3 & 0x7fffffff7fffffff;
      auVar24._8_4_ = (uint)puVar3[1] & 0x7fffffff;
      auVar24._12_4_ = *(uint *)((long)puVar3 + 0xc) & 0x7fffffff;
      auVar25 = maxps(auVar24,auVar25);
      auVar29._0_8_ = *(ulong *)((long)puVar10 + lVar13 + 0x18) & 0x7fffffff7fffffff;
      auVar29._8_8_ = 0;
      auVar30 = maxps(auVar29,auVar30);
    }
    auVar19 = divps(_DAT_001d5ef0,auVar25);
    auVar22._0_4_ = (float)(-(uint)(auVar25._0_4_ != 0.0) & auVar19._0_4_);
    auVar22._4_4_ = (float)(-(uint)(auVar25._4_4_ != 0.0) & auVar19._4_4_);
    auVar22._8_4_ = (float)(-(uint)(auVar25._8_4_ != 0.0) & auVar19._8_4_);
    auVar22._12_4_ = (float)(-(uint)(auVar25._12_4_ != 0.0) & auVar19._12_4_);
    auVar19 = divps(_DAT_001d5f00,auVar30);
    auVar25._0_4_ = (float)(-(uint)(auVar30._0_4_ != 0.0) & auVar19._0_4_);
    auVar25._4_4_ = (float)(-(uint)(auVar30._4_4_ != 0.0) & auVar19._4_4_);
    auVar25._8_4_ = (float)(-(uint)(auVar30._8_4_ != 0.0) & auVar19._8_4_);
    auVar25._12_4_ = (float)(-(uint)(auVar30._12_4_ != 0.0) & auVar19._12_4_);
    auVar30 = divps(_DAT_001d2d10,auVar22);
    (this->mCenterCoeff).x = (float)(auVar30._0_4_ & -(uint)(auVar22._0_4_ != 0.0));
    (this->mCenterCoeff).y = (float)(auVar30._4_4_ & -(uint)(auVar22._4_4_ != 0.0));
    (this->mCenterCoeff).z = (float)(auVar30._8_4_ & -(uint)(auVar22._8_4_ != 0.0));
    (this->mExtentsCoeff).x = (float)(auVar30._12_4_ & -(uint)(auVar22._12_4_ != 0.0));
    auVar30 = divps(_DAT_001c9a60,auVar25);
    (this->mExtentsCoeff).y = (float)(auVar30._0_4_ & -(uint)(auVar25._0_4_ != 0.0));
    (this->mExtentsCoeff).z = (float)(auVar30._4_4_ & -(uint)(auVar25._4_4_ != 0.0));
    for (uVar12 = 0; uVar12 != uVar18; uVar12 = uVar12 + 1) {
      pAVar1 = linear + uVar12;
      fVar4 = (pAVar1->mAABB).mCenter.x;
      fVar5 = (pAVar1->mAABB).mCenter.y;
      fVar23 = (pAVar1->mAABB).mCenter.z;
      fVar35 = (pAVar1->mAABB).mExtents.x;
      auVar30._0_4_ = (int)(auVar22._0_4_ * fVar4);
      auVar30._4_4_ = (int)(auVar22._4_4_ * fVar5);
      auVar30._8_4_ = (int)(auVar22._8_4_ * fVar23);
      auVar30._12_4_ = (int)(auVar22._12_4_ * fVar35);
      auVar19 = packssdw(auVar30,auVar30);
      uVar32 = auVar19._0_8_ & 0xffffffffffff | auVar30._6_8_ & 0xffff000000000000;
      pAVar7 = pAVar6 + uVar12;
      (pAVar7->mAABB).mCenter[0] = (short)uVar32;
      (pAVar7->mAABB).mCenter[1] = (short)(uVar32 >> 0x10);
      (pAVar7->mAABB).mCenter[2] = (short)(uVar32 >> 0x20);
      (pAVar7->mAABB).mExtents[0] = (short)(uVar32 >> 0x30);
      fVar26 = (float)puVar10[uVar12 * 4 + 3];
      fVar31 = (float)(puVar10[uVar12 * 4 + 3] >> 0x20);
      auVar33._0_4_ = (int)(auVar25._0_4_ * fVar26);
      auVar33._4_4_ = (int)(auVar25._4_4_ * fVar31);
      auVar33._8_4_ = (int)(auVar25._8_4_ * 0.0);
      auVar33._12_4_ = (int)(auVar25._12_4_ * 0.0);
      auVar30 = pshuflw(auVar33,auVar33,0xe8);
      *(int *)(puVar11 + uVar12 * 3 + 2) = auVar30._0_4_;
      local_40 = CONCAT44(fVar5 + fVar26,fVar4 + fVar35);
      local_38 = fVar23 + fVar31;
      local_50[0] = fVar4 - fVar35;
      local_50[1] = fVar5 - fVar26;
      local_50[2] = fVar23 - fVar31;
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        psVar2 = pAVar6[uVar12].mAABB.mCenter + lVar13;
        puVar16 = (uword *)(psVar2 + 3);
        fVar23 = (float)(int)*psVar2 * (&(this->mCenterCoeff).x)[lVar13];
        fVar4 = (&(this->mExtentsCoeff).x)[lVar13];
        fVar5 = *(float *)((long)&local_40 + lVar13 * 4);
        uVar17 = *puVar16;
        do {
          fVar35 = (float)uVar17 * fVar4;
          if ((fVar5 <= fVar23 + fVar35) &&
             (fVar35 = fVar23 - fVar35, fVar35 < local_50[lVar13] || fVar35 == local_50[lVar13])) {
            if (uVar17 != 0) goto LAB_00193971;
            break;
          }
          uVar17 = uVar17 + 1;
          *puVar16 = uVar17;
        } while (uVar17 != 0);
        *puVar16 = 0xffff;
LAB_00193971:
      }
      pAVar7 = (AABBQuantizedNode *)linear[uVar12].mData;
      pAVar15 = pAVar6 + ((uint)((int)pAVar7 - (int)linear) >> 5);
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar15 = pAVar7;
      }
      puVar11[uVar12 * 3 + 3] = (ulong)pAVar15;
    }
    operator_delete__(puVar10,*puVar10 << 5 | 8);
    bVar9 = true;
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool AABBQuantizedTree::Build(AABBTree* tree)
{
	// Checkings
	if(!tree)	return false;
	// Check the input tree is complete
	udword NbTriangles	= tree->GetNbPrimitives();
	udword NbNodes		= tree->GetNbNodes();
	if(NbNodes!=NbTriangles*2-1)	return false;

	// Get nodes
	mNbNodes = NbNodes;
	DELETEARRAY(mNodes);
	AABBCollisionNode* Nodes = new AABBCollisionNode[mNbNodes];
	CHECKALLOC(Nodes);

	// Build the tree
	udword CurID = 1;
	_BuildCollisionTree(Nodes, 0, CurID, tree);

	// Quantize
	{
		mNodes = new AABBQuantizedNode[mNbNodes];
		CHECKALLOC(mNodes);

		// Get max values
		FIND_MAX_VALUES

		// Quantization
		INIT_QUANTIZATION

		// Quantize
		uintptr_t Data;
		for(udword i=0;i<mNbNodes;i++)
		{
			PERFORM_QUANTIZATION
			REMAP_DATA(mData)
		}

		DELETEARRAY(Nodes);
	}

	return true;
}